

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::CheckDecorationsFromDecoration(ValidationState_t *vstate)

{
  ushort uVar1;
  uint16_t uVar2;
  _Rb_tree_color _Var3;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  int32_t iVar7;
  spv_result_t sVar8;
  Op OVar9;
  uint uVar10;
  uint32_t uVar11;
  StorageClass SVar12;
  uint32_t uVar13;
  Instruction *inst;
  DiagnosticStream *pDVar14;
  Instruction *pIVar15;
  _Rb_tree_node_base *p_Var16;
  const_iterator cVar17;
  long lVar18;
  pointer ppVar19;
  char *pcVar20;
  size_t index;
  string *val;
  char *dec_name;
  string local_280;
  _Base_ptr local_260;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_258;
  Instruction *local_250;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_248;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_240;
  _Base_ptr local_238;
  _Rb_tree_node_base *local_230;
  string local_228;
  DiagnosticStream local_208;
  
  bVar5 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,Shader);
  local_260 = (vstate->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_238 = &(vstate->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_260 != local_238) {
    local_240 = &(vstate->pointer_to_uniform_block_)._M_h;
    local_248 = &(vstate->pointer_to_storage_buffer_)._M_h;
    local_258 = &(vstate->pointer_to_storage_image_)._M_h;
    do {
      if (local_260[2]._M_left != (_Base_ptr)0x0) {
        inst = ValidationState_t::FindDef(vstate,local_260[1]._M_color);
        if (inst == (Instruction *)0x0) {
          __assert_fail("inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                        ,0x7d7,
                        "spv_result_t spvtools::val::(anonymous namespace)::CheckDecorationsFromDecoration(ValidationState_t &)"
                       );
        }
        if ((inst->inst_).opcode != 0x49) {
          p_Var16 = *(_Rb_tree_node_base **)(local_260 + 2);
          local_230 = (_Rb_tree_node_base *)&local_260[1]._M_left;
          if (p_Var16 != local_230) {
            do {
              _Var3 = p_Var16[1]._M_color;
              if ((int)_Var3 < 0x18) {
                if (_Var3 + ~_S_black < 2) {
                  if ((inst->inst_).result_id == 0) {
                    __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                                  ,0x797,
                                  "spv_result_t spvtools::val::(anonymous namespace)::CheckBlockDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                                 );
                  }
                  if ((inst->inst_).opcode != 0x1e) {
                    local_280._M_dataplus._M_p = "BufferBlock";
                    if (_Var3 == 2) {
                      local_280._M_dataplus._M_p = "Block";
                    }
                    ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                    pDVar14 = DiagnosticStream::operator<<(&local_208,(char **)&local_280);
                    lVar18 = 0x21;
                    pcVar20 = " decoration on a non-struct type.";
                    goto LAB_002ca34a;
                  }
                }
                else if (((_Var3 == _S_red) &&
                         (iVar7 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode), iVar7 != 0))
                        && ((p_Var16[2]._M_color == ~_S_red || ((inst->inst_).opcode != 0x1e)))) {
                  ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                  lVar18 = 0x35;
                  pcVar20 = "RelaxPrecision decoration cannot be applied to a type";
                  goto LAB_002ca6b1;
                }
              }
              else {
                switch(_Var3) {
                case 0x18:
                  if ((inst->inst_).result_id == 0) {
                    __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                                  ,0x6a5,
                                  "spv_result_t spvtools::val::(anonymous namespace)::CheckNonWritableDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                                 );
                  }
                  if (p_Var16[2]._M_color == ~_S_red) {
                    uVar11 = (inst->inst_).type_id;
                    uVar1 = (inst->inst_).opcode;
                    if (uVar1 < 0x1142) {
                      if (uVar1 != 0x37) {
                        index = 2;
                        if (uVar1 != 0x3b) {
LAB_002ca52b:
                          ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                          lVar18 = 0x69;
                          pcVar20 = 
                          "Target of NonWritable decoration must be a memory object declaration (a variable or a function parameter)"
                          ;
                          goto LAB_002ca6b1;
                        }
LAB_002ca7bb:
                        SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,index);
                        if (((SVar12 & ~Input) == Private) &&
                           ((vstate->features_).nonwritable_var_in_function_or_private != false))
                        break;
                      }
                    }
                    else {
                      if (uVar1 == 0x1142) {
                        index = 3;
                        goto LAB_002ca7bb;
                      }
                      if (uVar1 != 0x1516) goto LAB_002ca52b;
                    }
                    local_208._0_4_ = uVar11;
                    cVar17 = std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(local_240,(key_type_conflict *)&local_208);
                    if ((cVar17.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                         (__node_type *)0x0) &&
                       (((local_208._0_4_ = uVar11,
                         cVar17 = std::
                                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  ::find(local_248,(key_type_conflict *)&local_208),
                         cVar17.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                         (__node_type *)0x0 &&
                         (local_208._0_4_ = uVar11,
                         cVar17 = std::
                                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  ::find(local_258,(key_type_conflict *)&local_208), uVar1 != 0x1516
                         )) && (cVar17.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                                (__node_type *)0x0)))) {
                      pDVar14 = &local_208;
                      ValidationState_t::diag(pDVar14,vstate,SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar14,
                                 "Target of NonWritable decoration is invalid: must point to a storage image, uniform block, "
                                 ,0x5b);
                      local_280._M_dataplus._M_p = "or storage buffer";
                      if ((vstate->features_).nonwritable_var_in_function_or_private != false) {
                        local_280._M_dataplus._M_p =
                             "storage buffer, or variable in Private or Function storage class";
                      }
                      val = &local_280;
LAB_002ca2ff:
                      pDVar14 = DiagnosticStream::operator<<(pDVar14,(char **)val);
                      sVar8 = pDVar14->error_;
                      goto LAB_002ca6c1;
                    }
                  }
                  break;
                case 0x19:
                case 0x1c:
                case 0x1d:
                  break;
                case 0x1a:
                case 0x1b:
                  local_280._M_dataplus._M_p = "UniformId";
                  if (_Var3 == 0x1a) {
                    local_280._M_dataplus._M_p = "Uniform";
                  }
                  uVar11 = (inst->inst_).type_id;
                  if (uVar11 == 0) {
                    ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                    pDVar14 = DiagnosticStream::operator<<(&local_208,(char **)&local_280);
                    lVar18 = 0x23;
                    pcVar20 = " decoration applied to a non-object";
LAB_002ca34a:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar14,pcVar20,lVar18);
                    sVar8 = pDVar14->error_;
LAB_002ca6c1:
                    DiagnosticStream::~DiagnosticStream(&local_208);
                  }
                  else {
                    pIVar15 = ValidationState_t::FindDef(vstate,uVar11);
                    if (pIVar15 == (Instruction *)0x0) {
                      ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                      pDVar14 = DiagnosticStream::operator<<(&local_208,(char **)&local_280);
                      lVar18 = 0x32;
                      pcVar20 = " decoration applied to an object with invalid type";
                      goto LAB_002ca34a;
                    }
                    if ((pIVar15->inst_).opcode == 0x13) {
                      ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                      pDVar14 = DiagnosticStream::operator<<(&local_208,(char **)&local_280);
                      lVar18 = 0x2d;
                      pcVar20 = " decoration applied to a value with void type";
                      goto LAB_002ca34a;
                    }
                    if (p_Var16[1]._M_color != 0x1b) break;
                    if ((long)p_Var16[1]._M_left - (long)p_Var16[1]._M_parent != 4) {
                      __assert_fail("decoration.params().size() == 1 && \"Grammar ensures UniformId has one parameter\""
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                                    ,0x6fa,
                                    "spv_result_t spvtools::val::(anonymous namespace)::CheckUniformDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                                   );
                    }
                    sVar8 = ValidateExecutionScope(vstate,inst,(p_Var16[1]._M_parent)->_M_color);
                  }
                  if (sVar8 != SPV_SUCCESS) {
                    return sVar8;
                  }
                  break;
                case 0x1e:
                  uVar2 = (inst->inst_).opcode;
                  if ((uVar2 != 0x3b) && ((uVar2 != 0x1e || (p_Var16[2]._M_color == ~_S_red)))) {
                    ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                    lVar18 = 0x53;
                    pcVar20 = 
                    "Location decoration can only be applied to a variable or member of a structure type"
                    ;
LAB_002ca6b1:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,pcVar20,lVar18);
                    sVar8 = local_208.error_;
                    goto LAB_002ca6c1;
                  }
                  break;
                case 0x1f:
                  if ((inst->inst_).result_id == 0) {
                    __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                                  ,0x72a,
                                  "spv_result_t spvtools::val::(anonymous namespace)::CheckComponentDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                                 );
                  }
                  if ((long)p_Var16[1]._M_left - (long)p_Var16[1]._M_parent != 4) {
                    __assert_fail("decoration.params().size() == 1 && \"Grammar ensures Component has one parameter\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                                  ,0x72c,
                                  "spv_result_t spvtools::val::(anonymous namespace)::CheckComponentDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                                 );
                  }
                  uVar2 = (inst->inst_).opcode;
                  if ((long)(int)p_Var16[2]._M_color == -1) {
                    if (uVar2 != 0x37) {
                      if (uVar2 != 0x3b) {
                        ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                        lVar18 = 0x67;
                        pcVar20 = 
                        "Target of Component decoration must be a memory object declaration (a variable or a function parameter)"
                        ;
                        goto LAB_002ca6b1;
                      }
                      SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
                      if (((SVar12 != Input) && (SVar12 != Output)) && (SVar12 != Max)) {
                        ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,
                                   "Target of Component decoration is invalid: must point to a Storage Class of Input(1) or Output(3). Found Storage Class "
                                   ,0x77);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        sVar8 = local_208.error_;
                        goto LAB_002ca6c1;
                      }
                    }
                    uVar10 = (inst->inst_).type_id;
                    bVar6 = ValidationState_t::IsPointerType(vstate,uVar10);
                    if (bVar6) {
                      pIVar15 = ValidationState_t::FindDef(vstate,uVar10);
                      uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar15,2);
                    }
                  }
                  else {
                    if (uVar2 != 0x1e) {
                      ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_DATA,inst);
                      lVar18 = 0x4b;
                      pcVar20 = 
                      "Attempted to get underlying data type via member index for non-struct type.";
                      goto LAB_002ca6b1;
                    }
                    uVar10 = (inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(long)(int)p_Var16[2]._M_color + 2];
                  }
                  bVar6 = spvIsVulkanEnv(vstate->context_->target_env);
                  if (bVar6) {
                    OVar9 = ValidationState_t::GetIdOpcode(vstate,uVar10);
                    if (OVar9 == OpTypeArray) {
                      pIVar15 = ValidationState_t::FindDef(vstate,uVar10);
                      uVar10 = (pIVar15->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[2];
                    }
                    bVar6 = ValidationState_t::IsIntScalarOrVectorType(vstate,uVar10);
                    if ((bVar6) ||
                       (bVar6 = ValidationState_t::IsFloatScalarOrVectorType(vstate,uVar10), bVar6))
                    {
                      _Var3 = (p_Var16[1]._M_parent)->_M_color;
                      if (3 < _Var3) {
                        ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&local_280,vstate,0x1338,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,local_280._M_dataplus._M_p,
                                   local_280._M_string_length);
                        lVar18 = 0x35;
                        pcVar20 = "Component decoration value must not be greater than 3";
                        goto LAB_002caaf0;
                      }
                      uVar11 = ValidationState_t::GetDimension(vstate,uVar10);
                      uVar13 = ValidationState_t::GetBitWidth(vstate,uVar10);
                      if (uVar13 == 0x10) {
LAB_002ca715:
                        if (uVar11 + _Var3 < 5) break;
                        ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                        uVar11 = 0x1339;
LAB_002ca748:
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&local_280,vstate,uVar11,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,local_280._M_dataplus._M_p,
                                   local_280._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Sequence of components starting with ",
                                   0x25);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," and ending with ",0x11);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar18 = 0x13;
                        pcVar20 = " gets larger than 3";
                      }
                      else {
                        if (uVar13 != 0x40) {
                          if (uVar13 != 0x20) break;
                          goto LAB_002ca715;
                        }
                        if (uVar11 < 3) {
                          if ((_Var3 & _S_black) != _S_red) {
                            ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                            ValidationState_t::VkErrorID_abi_cxx11_
                                      (&local_280,vstate,0x133b,(char *)0x0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,local_280._M_dataplus._M_p,
                                       local_280._M_string_length);
                            lVar18 = 0x43;
                            pcVar20 = 
                            "Component decoration value must not be 1 or 3 for 64-bit data types";
                            goto LAB_002caaf0;
                          }
                          if (_Var3 + uVar11 * 2 < 5) break;
                          ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                          uVar11 = 0x133a;
                          goto LAB_002ca748;
                        }
                        ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&local_280,vstate,0x1e17,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,local_280._M_dataplus._M_p,
                                   local_280._M_string_length);
                        lVar18 = 0x49;
                        pcVar20 = 
                        "Component decoration only allowed on 64-bit scalar and 2-component vector";
                      }
LAB_002caaf0:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,pcVar20,lVar18);
                      sVar8 = local_208.error_;
                    }
                    else {
                      ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                      ValidationState_t::VkErrorID_abi_cxx11_(&local_280,vstate,0x133c,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,local_280._M_dataplus._M_p,
                                 local_280._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Component decoration specified for type ",
                                 0x28);
                      ValidationState_t::getIdName_abi_cxx11_(&local_228,vstate,uVar10);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,local_228._M_dataplus._M_p,
                                 local_228._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208," that is not a scalar or vector",0x1f);
                      sVar8 = local_208.error_;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_228._M_dataplus._M_p != &local_228.field_2) {
                        operator_delete(local_228._M_dataplus._M_p,
                                        local_228.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_280._M_dataplus._M_p != &local_280.field_2) {
                      operator_delete(local_280._M_dataplus._M_p,
                                      local_280.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_002ca6c1;
                  }
                  break;
                default:
                  if (_Var3 - 0x1175 < 2) {
                    uVar1 = (inst->inst_).opcode;
                    if (uVar1 < 0xc4) {
                      if (((6 < uVar1 - 0x7e) || ((0x55U >> (uVar1 - 0x7e & 0x1f) & 1) == 0)) &&
                         (uVar1 != 0xc)) {
LAB_002ca28b:
                        ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                        local_280._M_dataplus._M_p = "NoUnsignedWrap";
                        if (p_Var16[1]._M_color == 0x1175) {
                          local_280._M_dataplus._M_p = "NoSignedWrap";
                        }
                        pDVar14 = DiagnosticStream::operator<<(&local_208,(char **)&local_280);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar14," decoration may not be applied to ",0x22);
                        local_228._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
                        val = &local_228;
                        goto LAB_002ca2ff;
                      }
                    }
                    else if ((uVar1 != 0xc4) && (uVar1 != 0x1151)) goto LAB_002ca28b;
                  }
                  else if ((_Var3 == 0x27) && (bVar5)) {
                    if ((inst->inst_).opcode != 0x73) {
                      ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                      lVar18 = 0x6f;
                      pcVar20 = 
                      "FPRoundingMode decoration can be applied only to a width-only conversion instruction for floating-point object."
                      ;
                      goto LAB_002ca6b1;
                    }
                    bVar6 = spvIsVulkanEnv(vstate->context_->target_env);
                    if ((bVar6) && (_S_black < (p_Var16[1]._M_parent)->_M_color)) {
                      ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                      ValidationState_t::VkErrorID_abi_cxx11_(&local_280,vstate,0x1243,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,local_280._M_dataplus._M_p,
                                 local_280._M_string_length);
                      lVar18 = 0x3b;
                      pcVar20 = "In Vulkan, the FPRoundingMode mode must only by RTE or RTZ.";
                      goto LAB_002caaf0;
                    }
                    ppVar4 = (inst->uses_).
                             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    for (ppVar19 = (inst->uses_).
                                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start; ppVar19 != ppVar4;
                        ppVar19 = ppVar19 + 1) {
                      pIVar15 = ppVar19->first;
                      OVar9 = (Op)(pIVar15->inst_).opcode;
                      if ((((OVar9 != OpFConvert) && (bVar6 = spvOpcodeIsDebug(OVar9), !bVar6)) &&
                          (bVar6 = Instruction::IsNonSemantic(pIVar15), !bVar6)) &&
                         (bVar6 = spvOpcodeIsDecoration((uint)(pIVar15->inst_).opcode), !bVar6)) {
                        if (((pIVar15->inst_).opcode != 0x3e) || (ppVar19->second != 2)) {
                          ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                          lVar18 = 0x52;
                          pcVar20 = 
                          "FPRoundingMode decoration can be applied only to the Object operand of an OpStore."
                          ;
                          goto LAB_002ca6b1;
                        }
                        uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar15,0);
                        pIVar15 = ValidationState_t::FindDef(vstate,uVar10);
                        uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar15,0);
                        local_250 = ValidationState_t::FindDef(vstate,uVar10);
                        uVar10 = Instruction::GetOperandAs<unsigned_int>(local_250,2);
                        bVar6 = ValidationState_t::IsFloatScalarOrVectorType(vstate,uVar10);
                        if ((!bVar6) ||
                           (uVar11 = ValidationState_t::GetBitWidth(vstate,uVar10), uVar11 != 0x10))
                        {
                          ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                          lVar18 = 0x9f;
                          pcVar20 = 
                          "FPRoundingMode decoration can be applied only to the Object operand of an OpStore storing through a pointer to a 16-bit floating-point scalar or vector object."
                          ;
                          goto LAB_002ca6b1;
                        }
                        SVar12 = Instruction::GetOperandAs<spv::StorageClass>(local_250,1);
                        if (((StorageBuffer < SVar12) || ((0x120eU >> (SVar12 & 0x1f) & 1) == 0)) &&
                           (SVar12 != PhysicalStorageBuffer)) {
                          ValidationState_t::diag(&local_208,vstate,SPV_ERROR_INVALID_ID,inst);
                          lVar18 = 0xb7;
                          pcVar20 = 
                          "FPRoundingMode decoration can be applied only to the Object operand of an OpStore in the StorageBuffer, PhysicalStorageBuffer, Uniform, PushConstant, Input, or Output Storage Classes."
                          ;
                          goto LAB_002ca6b1;
                        }
                      }
                    }
                  }
                }
              }
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            } while (p_Var16 != local_230);
          }
        }
      }
      local_260 = (_Base_ptr)std::_Rb_tree_increment(local_260);
    } while (local_260 != local_238);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t CheckDecorationsFromDecoration(ValidationState_t& vstate) {
  // Some rules are only checked for shaders.
  const bool is_shader = vstate.HasCapability(spv::Capability::Shader);

  for (const auto& kv : vstate.id_decorations()) {
    const uint32_t id = kv.first;
    const auto& decorations = kv.second;
    if (decorations.empty()) continue;

    const Instruction* inst = vstate.FindDef(id);
    assert(inst);

    // We assume the decorations applied to a decoration group have already
    // been propagated down to the group members.
    if (inst->opcode() == spv::Op::OpDecorationGroup) continue;

    for (const auto& decoration : decorations) {
      switch (decoration.dec_type()) {
        case spv::Decoration::Component:
          PASS_OR_BAIL(CheckComponentDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::FPRoundingMode:
          if (is_shader)
            PASS_OR_BAIL(
                CheckFPRoundingModeForShaders(vstate, *inst, decoration));
          break;
        case spv::Decoration::NonWritable:
          PASS_OR_BAIL(CheckNonWritableDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Uniform:
        case spv::Decoration::UniformId:
          PASS_OR_BAIL(CheckUniformDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::NoSignedWrap:
        case spv::Decoration::NoUnsignedWrap:
          PASS_OR_BAIL(CheckIntegerWrapDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Block:
        case spv::Decoration::BufferBlock:
          PASS_OR_BAIL(CheckBlockDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Location:
          PASS_OR_BAIL(CheckLocationDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::RelaxedPrecision:
          PASS_OR_BAIL(
              CheckRelaxPrecisionDecoration(vstate, *inst, decoration));
          break;
        default:
          break;
      }
    }
  }
  return SPV_SUCCESS;
}